

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O1

void __thiscall
cmStringReplaceHelper::cmStringReplaceHelper
          (cmStringReplaceHelper *this,string *regex,string *replace_expr,cmMakefile *makefile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->ErrorString)._M_dataplus._M_p = (pointer)&(this->ErrorString).field_2;
  (this->ErrorString)._M_string_length = 0;
  (this->ErrorString).field_2._M_local_buf[0] = '\0';
  (this->RegExString)._M_dataplus._M_p = (pointer)&(this->RegExString).field_2;
  pcVar3 = (regex->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->RegExString,pcVar3,pcVar3 + regex->_M_string_length);
  (this->RegularExpression).regmatch.startp[0] = (char *)0x0;
  (this->RegularExpression).regmatch.endp[0] = (char *)0x0;
  (this->RegularExpression).regmatch.searchstring = (char *)0x0;
  (this->RegularExpression).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->RegularExpression,(regex->_M_dataplus)._M_p);
  this->ValidReplaceExpression = true;
  paVar1 = &(this->ReplaceExpression).field_2;
  (this->ReplaceExpression)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (replace_expr->_M_dataplus)._M_p;
  paVar2 = &replace_expr->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&replace_expr->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ReplaceExpression).field_2 + 8) = uVar4;
  }
  else {
    (this->ReplaceExpression)._M_dataplus._M_p = pcVar3;
    (this->ReplaceExpression).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->ReplaceExpression)._M_string_length = replace_expr->_M_string_length;
  (replace_expr->_M_dataplus)._M_p = (pointer)paVar2;
  replace_expr->_M_string_length = 0;
  (replace_expr->field_2)._M_local_buf[0] = '\0';
  (this->Replacements).
  super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Replacements).
  super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Replacements).
  super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->Makefile = makefile;
  ParseReplaceExpression(this);
  return;
}

Assistant:

cmStringReplaceHelper::cmStringReplaceHelper(const std::string& regex,
                                             std::string replace_expr,
                                             cmMakefile* makefile)
  : RegExString(regex)
  , RegularExpression(regex)
  , ReplaceExpression(std::move(replace_expr))
  , Makefile(makefile)
{
  this->ParseReplaceExpression();
}